

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockaddr.c
# Opt level: O0

size_t nni_posix_nn2sockaddr(void *sa,nni_sockaddr *na)

{
  size_t sVar1;
  nng_sockaddr_in6 *nsin6;
  sockaddr_in6 *sin6;
  size_t sz;
  nng_sockaddr_abstract *nsabs;
  nng_sockaddr_path *nspath;
  nng_sockaddr_in *nsin;
  sockaddr_un *spath;
  sockaddr_in *sin;
  nni_sockaddr *na_local;
  void *sa_local;
  
  if ((sa == (void *)0x0) || (na == (nni_sockaddr *)0x0)) {
    sa_local = (void *)0x0;
  }
  else {
    switch(na->s_family) {
    case 2:
      memset(sa,0,0x6e);
      sVar1 = nni_strlcpy((char *)((long)sa + 2),(na->s_ipc).sa_path,0x6c);
      if (sVar1 < 0x6c) {
        *(undefined2 *)sa = 1;
        sa_local = (void *)0x6e;
      }
      else {
        sa_local = (void *)0x0;
      }
      break;
    case 3:
      memset(sa,0,0x10);
      *(undefined2 *)sa = 2;
      *(uint16_t *)((long)sa + 2) = (na->s_in6).sa_port;
      *(uint32_t *)((long)sa + 4) = (na->s_in).sa_addr;
      sa_local = (void *)0x10;
      break;
    case 4:
      memset(sa,0,0x1c);
      *(undefined2 *)sa = 10;
      *(uint16_t *)((long)sa + 2) = (na->s_in6).sa_port;
      *(uint32_t *)((long)sa + 0x18) = (na->s_in6).sa_scope;
      *(undefined8 *)((long)sa + 8) = *(undefined8 *)((na->s_ipc).sa_path + 2);
      *(undefined8 *)((long)sa + 0x10) = *(undefined8 *)((long)(na->s_storage).sa_pad + 4);
      sa_local = (void *)0x1c;
      break;
    case 5:
      if ((na->s_in6).sa_port < 0x6c) {
        memset(sa,0,0x6e);
        *(undefined2 *)sa = 1;
        *(undefined1 *)((long)sa + 2) = 0;
        if ((na->s_in6).sa_port == 0) {
          sa_local = (void *)0x2;
        }
        else {
          memcpy((void *)((long)sa + 3),(na->s_ipc).sa_path + 2,(ulong)(na->s_in6).sa_port);
          sa_local = (void *)((ulong)(na->s_in6).sa_port + 3);
        }
      }
      else {
        sa_local = (void *)0x0;
      }
      break;
    default:
      sa_local = (void *)0x0;
    }
  }
  return (size_t)sa_local;
}

Assistant:

size_t
nni_posix_nn2sockaddr(void *sa, const nni_sockaddr *na)
{
	struct sockaddr_in          *sin;
	struct sockaddr_un          *spath;
	const nng_sockaddr_in       *nsin;
	const nng_sockaddr_path     *nspath;
	const nng_sockaddr_abstract *nsabs;
	size_t                       sz;
#ifdef NNG_ENABLE_IPV6
	struct sockaddr_in6    *sin6;
	const nng_sockaddr_in6 *nsin6;
#endif

	if ((sa == NULL) || (na == NULL)) {
		return (0);
	}
	switch (na->s_family) {
	case NNG_AF_INET:
		sin  = (void *) sa;
		nsin = &na->s_in;
		memset(sin, 0, sizeof(*sin));
		sin->sin_family      = PF_INET;
		sin->sin_port        = nsin->sa_port;
		sin->sin_addr.s_addr = nsin->sa_addr;
		return (sizeof(*sin));

#ifdef NNG_ENABLE_IPV6
	case NNG_AF_INET6:
		sin6  = (void *) sa;
		nsin6 = &na->s_in6;
		memset(sin6, 0, sizeof(*sin6));
#ifdef SIN6_LEN
		sin6->sin6_len = sizeof(*sin6);
#endif
		sin6->sin6_family   = PF_INET6;
		sin6->sin6_port     = nsin6->sa_port;
		sin6->sin6_scope_id = nsin6->sa_scope;
		memcpy(sin6->sin6_addr.s6_addr, nsin6->sa_addr, 16);
		return (sizeof(*sin6));
#endif

	case NNG_AF_IPC:
		spath  = (void *) sa;
		nspath = &na->s_ipc;
		memset(spath, 0, sizeof(*spath));
		// Make sure that the path fits!
		sz = sizeof(spath->sun_path);
		if (nni_strlcpy(spath->sun_path, nspath->sa_path, sz) >= sz) {
			return (0);
		}
		spath->sun_family = PF_UNIX;
		return (sizeof(*spath));

	case NNG_AF_ABSTRACT:
		spath = (void *) sa;
		nsabs = &na->s_abstract;
		if (nsabs->sa_len >= sizeof(spath->sun_path)) {
			return (0);
		}
		memset(spath, 0, sizeof(*spath));
		spath->sun_family  = PF_UNIX;
		spath->sun_path[0] = '\0'; // abstract starts with nul

		// We support auto-bind with an empty string.  There is
		// a subtle caveat here, which is that we cannot bind to
		// the *empty* name.
		if (nsabs->sa_len == 0) {
			return (sizeof(sa_family_t)); // auto bind
		} else {
			memcpy(&spath->sun_path[1], nsabs->sa_name,
			    nsabs->sa_len);
			return (sizeof(sa_family_t) + 1 + nsabs->sa_len);
		}
	}
	return (0);
}